

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall cppcms::http::details::output_device::~output_device(output_device *this)

{
  void *in_RDI;
  
  ~output_device((output_device *)0x39fa68);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual bool do_write(cppcms::impl::cgi::connection &c,booster::aio::const_buffer const &out,bool eof,booster::system::error_code &e) 
		{
			return c.write(out,eof,e);
		}